

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_level.c
# Opt level: O2

void CGTFS_RecordLevel(void)

{
  int iVar1;
  int iVar2;
  level_t a;
  char *field_names [3];
  char *field_values [3];
  level_t local_140;
  level_t d;
  
  iVar1 = greatest_test_pre("level_read");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      iVar1 = -1;
      field_names[2] = "level_name";
      field_names[0] = "level_id";
      field_names[1] = "level_index";
      field_values[2] = "Another damn level";
      field_values[0] = "INDEX123_abc";
      field_values[1] = "0.435";
      read_level(&a,3,field_names,field_values);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar2 = greatest_do_assert_equal_t("INDEX123_abc",&a,&greatest_type_info_string,(void *)0x0);
      if (iVar2 == 0) {
        greatest_info.fail_line = 0x13;
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
LAB_00120ae7:
          greatest_info.msg = "type_info->equal callback missing!";
        }
        else {
          greatest_info.msg = "\"INDEX123_abc\" != lvl_1.id";
        }
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar2 = greatest_do_assert_equal_t
                          ("Another damn level",a.name,&greatest_type_info_string,(void *)0x0);
        if (iVar2 == 0) {
          greatest_info.fail_line = 0x14;
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_00120ae7;
          greatest_info.msg = "\"Another damn level\" != lvl_1.name";
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          if ((a.index == 0.435) && (!NAN(a.index))) {
            greatest_info.msg = (char *)0x0;
            iVar1 = 0;
            goto LAB_00120b05;
          }
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%f",0x3d70a3d7);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%f",a.index._0_4_);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x15;
          greatest_info.msg = "0.435 != lvl_1.index";
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_level.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00120d36;
    }
LAB_00120b05:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("level_compare");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    memcpy(&a,"SOMEID123",0x88);
    memcpy((level_t *)field_names,"SOMEID123",0x88);
    memcpy(field_values,"SOMEID456",0x88);
    memcpy(&d,"SOMEID123",0x88);
    memcpy(&local_140,"SOMEID123",0x88);
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_level(&a,(level_t *)field_names);
    if (iVar1 == 1) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_level(&a,(level_t *)field_values);
      if (iVar1 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_level((level_t *)field_names,(level_t *)field_values);
        if (iVar1 == 0) {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar1 = equal_level((level_t *)field_names,&d);
          if (iVar1 == 0) {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar1 = equal_level((level_t *)field_names,&local_140);
            if (iVar1 == 0) {
              greatest_info.msg = (char *)0x0;
              iVar1 = 0;
              goto LAB_00120c3a;
            }
            greatest_info.fail_line = 0x3d;
            greatest_info.msg = "0 != equal_level(&b, &e)";
          }
          else {
            greatest_info.fail_line = 0x3c;
            greatest_info.msg = "0 != equal_level(&b, &d)";
          }
        }
        else {
          greatest_info.fail_line = 0x3b;
          greatest_info.msg = "0 != equal_level(&b, &c)";
        }
      }
      else {
        greatest_info.fail_line = 0x3a;
        greatest_info.msg = "0 != equal_level(&a, &c)";
      }
    }
    else {
      greatest_info.fail_line = 0x39;
      greatest_info.msg = "1 != equal_level(&a, &b)";
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_level.c"
    ;
    if ((greatest_info.flags & 4) != 0) {
LAB_00120d36:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_level.c"
      ;
      abort();
    }
    iVar1 = -1;
  }
LAB_00120c3a:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_RecordLevel) {
    RUN_TEST(level_read);
    RUN_TEST(level_compare);
}